

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O1

void __thiscall APITests::test_setup_twice(APITests *this)

{
  int iVar1;
  string local_38;
  
  GPIO::setmode(BOARD);
  GPIO::setup((this->pin_data).out_a,OUT,1);
  GPIO::setup((this->pin_data).out_a,OUT,1);
  GPIO::setup((this->pin_data).in_a,IN,-1);
  GPIO::setup((this->pin_data).in_a,IN,-1);
  iVar1 = GPIO::input((this->pin_data).in_a);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  assert::is_true(iVar1 == 1,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  GPIO::cleanup();
  return;
}

Assistant:

void test_setup_twice()
    {
        GPIO::setmode(GPIO::BOARD);
        GPIO::setup(pin_data.out_a, GPIO::OUT, GPIO::HIGH);
        GPIO::setup(pin_data.out_a, GPIO::OUT, GPIO::HIGH);

        GPIO::setup(pin_data.in_a, GPIO::IN);
        GPIO::setup(pin_data.in_a, GPIO::IN);

        auto val = GPIO::input(pin_data.in_a);
        assert::is_true(val == GPIO::HIGH);

        GPIO::cleanup();
    }